

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.hpp
# Opt level: O2

void boost::hash_detail::hash_combine_impl(uint64_t *h,uint64_t k)

{
  *h = ((k * -0x395b586ca42e166b >> 0x2f ^ k * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ *h) *
       -0x395b586ca42e166b + 0xe6546b64;
  return;
}

Assistant:

inline void hash_combine_impl(boost::uint64_t& h,
                boost::uint64_t k)
        {
            const boost::uint64_t m = UINT64_C(0xc6a4a7935bd1e995);
            const int r = 47;

            k *= m;
            k ^= k >> r;
            k *= m;

            h ^= k;
            h *= m;

            // Completely arbitrary number, to prevent 0's
            // from hashing to 0.
            h += 0xe6546b64;
        }